

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_Buffer.cpp
# Opt level: O2

void __thiscall Stereo_Buffer::end_frame(Stereo_Buffer *this,blip_time_t clock_count,bool stereo)

{
  long lVar1;
  
  for (lVar1 = 0x18; lVar1 != 0xf0; lVar1 = lVar1 + 0x48) {
    Blip_Buffer::end_frame
              ((Blip_Buffer *)((long)&(this->super_Multi_Buffer)._vptr_Multi_Buffer + lVar1),
               clock_count);
  }
  this->stereo_added = (bool)(this->stereo_added | stereo);
  return;
}

Assistant:

void Stereo_Buffer::end_frame( blip_time_t clock_count, bool stereo )
{
	for ( unsigned i = 0; i < buf_count; i++ )
		bufs [i].end_frame( clock_count );
	
	stereo_added |= stereo;
}